

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

int lyd_merge_parent_children(lyd_node *target,lyd_node *source,int options)

{
  LYS_NODE LVar1;
  ly_ctx *ctx;
  lyd_node *plVar2;
  lyd_node *plVar3;
  int iVar4;
  LY_ERR *pLVar5;
  lyd_node *node2;
  lyd_node *plVar6;
  lyd_node *in_R8;
  lyd_node *plVar7;
  lyd_node *plVar8;
  lyd_node *plVar9;
  byte bVar10;
  lyd_node *plVar11;
  lyd_node *local_60;
  
  if (source == (lyd_node *)0x0) {
    source = (lyd_node *)0x0;
  }
  else {
    ctx = target->schema->module->ctx;
    plVar6 = source;
    do {
      plVar2 = plVar6->next;
      node2 = plVar6;
      plVar11 = target;
      do {
        if ((((uint)options >> 8 & 1) == 0) || ((node2->field_0x9 & 1) == 0)) {
          plVar7 = plVar11->child;
          if (plVar7 == (lyd_node *)0x0) {
            plVar7 = (lyd_node *)0x0;
            bVar10 = 0;
          }
          else {
            do {
              iVar4 = lyd_merge_node_equal(plVar7,node2);
              if (iVar4 != 0) {
                bVar10 = 1;
                if ((plVar7->schema->nodetype & (LYS_ANYDATA|LYS_LEAF)) != LYS_UNKNOWN) {
                  lyd_merge_node_update(plVar7,node2);
                }
                goto LAB_0015db43;
              }
              pLVar5 = ly_errno_location();
              if (*pLVar5 != LY_SUCCESS) {
                return 1;
              }
              plVar7 = plVar7->next;
            } while (plVar7 != (lyd_node *)0x0);
            plVar7 = (lyd_node *)0x0;
            bVar10 = 0;
          }
LAB_0015db43:
          in_R8 = node2;
          plVar8 = plVar7;
          local_60 = plVar11;
          if (((node2->schema->nodetype & (LYS_LIST|LYS_CONTAINER)) == LYS_UNKNOWN) ||
             (plVar9 = node2->child, !(bool)(bVar10 & node2->child != (lyd_node *)0x0)))
          goto LAB_0015db7b;
        }
        else {
          plVar8 = (lyd_node *)0x1;
          if (node2 == plVar6) break;
LAB_0015db7b:
          plVar7 = plVar11;
          if (node2 == plVar6) {
            LVar1 = node2->schema->nodetype;
            if (LVar1 == LYS_CONTAINER) break;
            if (plVar8 == (lyd_node *)0x0) {
              plVar9 = (lyd_node *)0x0;
              node2 = plVar6;
            }
            else {
              plVar9 = (lyd_node *)0x0;
              node2 = plVar6;
              if ((LVar1 & (LYS_ANYDATA|LYS_LEAF)) != LYS_UNKNOWN) break;
            }
          }
          else {
            plVar9 = node2->next;
            if (plVar9 == (lyd_node *)0x0) {
              plVar3 = node2->parent;
              do {
                node2 = plVar3;
                if (node2->parent == plVar6->parent) {
                  plVar9 = (lyd_node *)0x0;
                  plVar7 = plVar11;
                  break;
                }
                plVar9 = node2->next;
                plVar11 = plVar11->parent;
                plVar3 = node2->parent;
                plVar7 = plVar11;
              } while (plVar9 == (lyd_node *)0x0);
            }
            if (plVar8 != (lyd_node *)0x0) goto LAB_0015dc3e;
          }
          if (ctx == in_R8->schema->module->ctx) {
            lyd_unlink_internal(in_R8,1);
          }
          else {
            in_R8 = lyd_dup_to_ctx(in_R8,1,ctx);
          }
          iVar4 = lyd_insert(local_60,in_R8);
          if (iVar4 != 0) {
            pLVar5 = ly_errno_location();
            *pLVar5 = LY_EINT;
            ly_log(LY_LLERR,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                   ,0x804);
            iVar4 = 1;
            goto LAB_0015dc8c;
          }
          if (node2 == plVar6) {
            if (source == plVar6) {
              source = source->next;
            }
            break;
          }
        }
LAB_0015dc3e:
        node2 = plVar9;
        plVar11 = plVar7;
      } while (node2 != (lyd_node *)0x0);
      plVar6 = plVar2;
    } while (plVar2 != (lyd_node *)0x0);
  }
  iVar4 = 0;
LAB_0015dc8c:
  lyd_free_withsiblings(source);
  return iVar4;
}

Assistant:

static int
lyd_merge_parent_children(struct lyd_node *target, struct lyd_node *source, int options)
{
    struct lyd_node *trg_parent, *src, *src_backup, *src_elem, *src_elem_backup, *src_next, *trg_child, *trg_parent_backup;
    struct ly_ctx *ctx = target->schema->module->ctx; /* shortcut */

    LY_TREE_FOR_SAFE(source, src_backup, src) {
        for (src_elem = src_next = src, trg_parent = target;
            src_elem;
            src_elem = src_next) {

            /* it won't get inserted in this case */
            if (src_elem->dflt && (options & LYD_OPT_EXPLICIT)) {
                if (src_elem == src) {
                    /* we are done with this subtree in this case */
                    break;
                }
                trg_child = (struct lyd_node *)1;
                goto src_skip;
            }

            LY_TREE_FOR(trg_parent->child, trg_child) {
                /* schema match, data match? */
                if (lyd_merge_node_equal(trg_child, src_elem)) {
                    if (trg_child->schema->nodetype & (LYS_LEAF | LYS_ANYDATA)) {
                        lyd_merge_node_update(trg_child, src_elem);
                    }
                    break;
                } else if (ly_errno) {
                    return EXIT_FAILURE;
                }
            }

            /* first prepare for the next iteration */
            src_elem_backup = src_elem;
            trg_parent_backup = trg_parent;
            if ((src_elem->schema->nodetype & (LYS_CONTAINER | LYS_LIST)) && src_elem->child && trg_child) {
                /* go into children */
                src_next = src_elem->child;
                trg_parent = trg_child;
            } else {
src_skip:
                /* no children (or the whole subtree will be inserted), try siblings */
                if (src_elem == src) {
                    /* we are done, src has no children ... */
                    if ((src_elem->schema->nodetype == LYS_CONTAINER)
                        || ((src_elem->schema->nodetype & (LYS_LEAF | LYS_ANYDATA)) && trg_child)) {
                        /* and it's a container (empty one) or an already-updated leaf/anydata, nothing else to do */
                        break;
                    } else {
                        /* ... but we still need to insert it */
                        src_next = NULL;
                        goto src_insert;
                    }
                } else {
                    src_next = src_elem->next;
                    /* trg_parent does not change */
                }
            }
            while (!src_next) {
                src_elem = src_elem->parent;
                if (src_elem->parent == src->parent) {
                    /* we are done, no next element to process */
                    break;
                }

                /* parent is already processed, go to its sibling */
                src_next = src_elem->next;
                trg_parent = trg_parent->parent;
            }

            if (!trg_child) {
src_insert:
                /* we need to insert the whole subtree */
                if (ctx == src_elem_backup->schema->module->ctx) {
                    /* same context - unlink the subtree and insert it into the target */
                    lyd_unlink(src_elem_backup);
                } else {
                    /* different contexts - before inserting subtree, instead of unlinking, duplicate it into the
                     * target context */
                    src_elem_backup = lyd_dup_to_ctx(src_elem_backup, 1, ctx);
                }

                /* insert subtree into the target */
                if (lyd_insert(trg_parent_backup, src_elem_backup)) {
                    LOGINT;
                    lyd_free_withsiblings(source);
                    return EXIT_FAILURE;
                }
                if (src_elem == src) {
                    /* we are finished for this src, we spent it, so forget the pointer if available */
                    if (source == src) {
                        source = source->next;
                    }
                    break;
                }
            }
        }
    }

    lyd_free_withsiblings(source);
    return EXIT_SUCCESS;
}